

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdas_obj.cpp
# Opt level: O2

uint32_t parseNumber(FileStackNode *where,uint32_t lineNo,char *str,NumberType base)

{
  int __c;
  uint32_t uVar1;
  void *pvVar2;
  char *pcVar3;
  char cVar4;
  
  cVar4 = *str;
  if (cVar4 == '\0') {
    fatal(where,lineNo,"Expected number, got empty string");
  }
  pcVar3 = str + 1;
  uVar1 = 0;
  while( true ) {
    __c = toupper((int)cVar4);
    pvVar2 = memchr("0123456789ABCDEF",__c,0x11);
    if ((pvVar2 == (void *)0x0) || ((long)(ulong)base <= (long)pvVar2 + -0x10dd21)) break;
    uVar1 = (int)((long)pvVar2 + -0x10dd21) + uVar1 * base;
    cVar4 = *pcVar3;
    pcVar3 = pcVar3 + 1;
  }
  if (cVar4 == '\0') {
    return uVar1;
  }
  fatal(where,lineNo,"Expected number, got \"%s\"",str);
}

Assistant:

static uint32_t parseNumber(struct FileStackNode const *where, uint32_t lineNo, char const *restrict str, enum NumberType base) {
	if (str[0] == '\0')
		fatal(where, lineNo, "Expected number, got empty string");

	char const *endptr;
	uint32_t res = readNumber(str, &endptr, base);

	if (*endptr != '\0')
		fatal(where, lineNo, "Expected number, got \"%s\"", str);
	return res;
}